

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngread.c
# Opt level: O0

void png_read_info(png_structrp png_ptr,png_inforp info_ptr)

{
  png_uint_32 chunk_name_00;
  png_uint_32 length_00;
  int keep_00;
  png_uint_32 chunk_name;
  png_uint_32 length;
  int keep;
  png_inforp info_ptr_local;
  png_structrp png_ptr_local;
  
  if ((png_ptr != (png_structrp)0x0) && (info_ptr != (png_inforp)0x0)) {
    png_read_sig(png_ptr,info_ptr);
    do {
      while( true ) {
        while( true ) {
          while( true ) {
            while( true ) {
              length_00 = png_read_chunk_header(png_ptr);
              chunk_name_00 = png_ptr->chunk_name;
              if (chunk_name_00 == 0x49444154) {
                if ((png_ptr->mode & 1) == 0) {
                  png_chunk_error(png_ptr,"Missing IHDR before IDAT");
                }
                if ((png_ptr->color_type == '\x03') && ((png_ptr->mode & 2) == 0)) {
                  png_chunk_error(png_ptr,"Missing PLTE before IDAT");
                }
                if ((png_ptr->mode & 8) != 0) {
                  png_chunk_benign_error(png_ptr,"Too many IDATs found");
                }
                png_ptr->mode = png_ptr->mode | 4;
              }
              else if ((png_ptr->mode & 4) != 0) {
                png_ptr->mode = png_ptr->mode | 0x2000;
                png_ptr->mode = png_ptr->mode | 8;
              }
              if (chunk_name_00 != 0x49484452) break;
              png_handle_chunk(png_ptr,info_ptr,length_00);
            }
            if (chunk_name_00 != 0x49454e44) break;
            png_handle_chunk(png_ptr,info_ptr,length_00);
          }
          keep_00 = png_chunk_unknown_handling(png_ptr,chunk_name_00);
          if (keep_00 != 0) break;
          if (chunk_name_00 == 0x49444154) {
            png_ptr->idat_size = length_00;
            return;
          }
          png_handle_chunk(png_ptr,info_ptr,length_00);
        }
        png_handle_unknown(png_ptr,info_ptr,length_00,keep_00);
        if (chunk_name_00 != 0x504c5445) break;
        png_ptr->mode = png_ptr->mode | 2;
      }
    } while (chunk_name_00 != 0x49444154);
    png_ptr->idat_size = 0;
  }
  return;
}

Assistant:

void PNGAPI
png_read_info(png_structrp png_ptr, png_inforp info_ptr)
{
#ifdef PNG_HANDLE_AS_UNKNOWN_SUPPORTED
   int keep;
#endif

   png_debug(1, "in png_read_info");

   if (png_ptr == NULL || info_ptr == NULL)
      return;

   /* Read and check the PNG file signature. */
   png_read_sig(png_ptr, info_ptr);

   for (;;)
   {
      png_uint_32 length = png_read_chunk_header(png_ptr);
      png_uint_32 chunk_name = png_ptr->chunk_name;

      /* IDAT logic needs to happen here to simplify getting the two flags
       * right.
       */
      if (chunk_name == png_IDAT)
      {
         if ((png_ptr->mode & PNG_HAVE_IHDR) == 0)
            png_chunk_error(png_ptr, "Missing IHDR before IDAT");

         else if (png_ptr->color_type == PNG_COLOR_TYPE_PALETTE &&
             (png_ptr->mode & PNG_HAVE_PLTE) == 0)
            png_chunk_error(png_ptr, "Missing PLTE before IDAT");

         else if ((png_ptr->mode & PNG_AFTER_IDAT) != 0)
            png_chunk_benign_error(png_ptr, "Too many IDATs found");

         png_ptr->mode |= PNG_HAVE_IDAT;
      }

      else if ((png_ptr->mode & PNG_HAVE_IDAT) != 0)
      {
         png_ptr->mode |= PNG_HAVE_CHUNK_AFTER_IDAT;
         png_ptr->mode |= PNG_AFTER_IDAT;
      }

      if (chunk_name == png_IHDR)
         png_handle_chunk(png_ptr, info_ptr, length);

      else if (chunk_name == png_IEND)
         png_handle_chunk(png_ptr, info_ptr, length);

#ifdef PNG_HANDLE_AS_UNKNOWN_SUPPORTED
      else if ((keep = png_chunk_unknown_handling(png_ptr, chunk_name)) != 0)
      {
         png_handle_unknown(png_ptr, info_ptr, length, keep);

         if (chunk_name == png_PLTE)
            png_ptr->mode |= PNG_HAVE_PLTE;

         else if (chunk_name == png_IDAT)
         {
            png_ptr->idat_size = 0; /* It has been consumed */
            break;
         }
      }
#endif

      else if (chunk_name == png_IDAT)
      {
         png_ptr->idat_size = length;
         break;
      }

      else
         png_handle_chunk(png_ptr, info_ptr, length);
   }
}